

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

void VW::finish(vw *all,bool delete_all)

{
  vw_ostream *pvVar1;
  double dVar2;
  options_i *poVar3;
  _func_int *p_Var4;
  pointer pcVar5;
  parser *ppVar6;
  substring *__ptr;
  features *this;
  char cVar7;
  float fVar8;
  float fVar9;
  bool bVar10;
  int iVar11;
  ostream *poVar12;
  vw_ostream *pvVar13;
  char *pcVar14;
  pointer pdVar15;
  vw_exception *this_00;
  bool *pbVar16;
  int *piVar17;
  long lVar18;
  feature_dict *pfVar19;
  undefined7 in_register_00000031;
  shared_data *psVar20;
  int *__ptr_00;
  ulong uVar21;
  char *pcVar22;
  float best_constant_loss;
  vw_exception finalize_regressor_exception;
  float local_b4 [3];
  vw_exception local_a8;
  string local_70;
  string local_50;
  
  if (all->quiet != false) goto LAB_0012d96b;
  poVar3 = all->options;
  local_a8._0_8_ = (long)&local_a8 + 0x10U;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"audit_regressor","");
  iVar11 = (*poVar3->_vptr_options_i[1])(poVar3,&local_a8);
  if (local_a8._0_8_ != (long)&local_a8 + 0x10U) {
    operator_delete((void *)local_a8._0_8_);
  }
  if ((char)iVar11 != '\0') goto LAB_0012d96b;
  pvVar1 = &all->trace_message;
  *(undefined8 *)
   (&(all->trace_message).super_ostream.field_0x8 +
   (long)(all->trace_message).super_ostream._vptr_basic_ostream[-3]) = 6;
  p_Var4 = (all->trace_message).super_ostream._vptr_basic_ostream[-3];
  *(uint *)(&(all->trace_message).super_ostream.field_0x18 + (long)p_Var4) =
       *(uint *)(&(all->trace_message).super_ostream.field_0x18 + (long)p_Var4) & 0xfffffefb | 4;
  cVar7 = (char)pvVar1;
  std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar7);
  std::ostream::put(cVar7);
  poVar12 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"finished run",0xc);
  uVar21 = all->current_pass;
  std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar7);
  std::ostream::put(cVar7);
  poVar12 = (ostream *)std::ostream::flush();
  if (uVar21 < 2) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"number of examples = ",0x15);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"number of examples per pass = ",0x1e);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar7);
    std::ostream::put(cVar7);
    poVar12 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"passes used = ",0xe);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar7);
  std::ostream::put(cVar7);
  poVar12 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"weighted example sum = ",0x17);
  std::ostream::_M_insert<double>
            (all->sd->weighted_labeled_examples + all->sd->weighted_unlabeled_examples);
  std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar7);
  std::ostream::put(cVar7);
  poVar12 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"weighted label sum = ",0x15);
  std::ostream::_M_insert<double>(all->sd->weighted_labels);
  std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar7);
  std::ostream::put(cVar7);
  poVar12 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"average loss = ",0xf);
  psVar20 = all->sd;
  pvVar13 = pvVar1;
  if (all->holdout_set_off == true) {
    if (psVar20->weighted_labeled_examples <= 0.0) {
      pcVar22 = "n.a.";
      lVar18 = 4;
      goto LAB_0012d727;
    }
    std::ostream::_M_insert<double>(psVar20->sum_loss / psVar20->weighted_labeled_examples);
  }
  else {
    dVar2 = psVar20->holdout_best_loss;
    if (((dVar2 == 3.4028234663852886e+38) && (!NAN(dVar2))) ||
       ((dVar2 == 1.7014117331926443e+38 && (!NAN(dVar2))))) {
      pcVar22 = "undefined (no holdout)";
      lVar18 = 0x16;
    }
    else {
      pvVar13 = (vw_ostream *)std::ostream::_M_insert<double>(dVar2);
      pcVar22 = " h";
      lVar18 = 2;
    }
LAB_0012d727:
    std::__ostream_insert<char,std::char_traits<char>>(&pvVar13->super_ostream,pcVar22,lVar18);
  }
  if (all->sd->report_multiclass_log_loss == true) {
    bVar10 = all->holdout_set_off;
    std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar7);
    std::ostream::put(cVar7);
    poVar12 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"average multiclass log loss = ",0x1e);
    psVar20 = all->sd;
    if (bVar10 == true) {
      std::ostream::_M_insert<double>
                (psVar20->multiclass_log_loss / psVar20->weighted_labeled_examples);
    }
    else {
      poVar12 = std::ostream::_M_insert<double>
                          (psVar20->holdout_multiclass_log_loss / psVar20->weighted_labeled_examples
                          );
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," h",2);
    }
  }
  bVar10 = get_best_constant(all,(float *)&local_a8,local_b4);
  if (bVar10) {
    std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + cVar7);
    std::ostream::put(cVar7);
    poVar12 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"best constant = ",0x10);
    std::ostream::_M_insert<double>((double)(float)local_a8._0_4_);
    if ((local_b4[0] != 1.1754944e-38) || (NAN(local_b4[0]))) {
      std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + cVar7);
      std::ostream::put(cVar7);
      poVar12 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"best constant\'s loss = ",0x17);
      std::ostream::_M_insert<double>((double)local_b4[0]);
    }
  }
  std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar7);
  std::ostream::put(cVar7);
  poVar12 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"total feature number = ",0x17);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  if (all->sd->queries != 0) {
    std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar7);
    std::ostream::put(cVar7);
    poVar12 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"total queries = ",0x10);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  }
  std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
LAB_0012d96b:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"empty","");
  vw_exception::vw_exception
            (&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
             ,0x70b,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar5 = (all->final_regressor_name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar5,pcVar5 + (all->final_regressor_name)._M_string_length);
  finalize_regressor(all,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (all->l != (learner<char,_char> *)0x0) {
    LEARNER::learner<char,_char>::finish(all->l);
    if (all->l != (base_learner *)0x0) {
      free(all->l);
    }
  }
  if ((all->should_delete_options == true) && (all->options != (options_i *)0x0)) {
    (*all->options->_vptr_options_i[9])();
  }
  free_parser(all);
  finalize_source(all->p);
  v_array<substring>::clear(&all->p->parse_name);
  ppVar6 = all->p;
  __ptr = (ppVar6->parse_name)._begin;
  if (__ptr != (substring *)0x0) {
    free(__ptr);
  }
  (ppVar6->parse_name)._begin = (substring *)0x0;
  (ppVar6->parse_name)._end = (substring *)0x0;
  (ppVar6->parse_name).end_array = (substring *)0x0;
  ppVar6 = all->p;
  if (ppVar6 != (parser *)0x0) {
    parser::~parser(ppVar6);
  }
  operator_delete(ppVar6);
  pbVar16 = &(all->weights).dense_weights._seeded;
  if ((all->weights).sparse != false) {
    pbVar16 = &(all->weights).sparse_weights._seeded;
  }
  if (*pbVar16 == false) {
    psVar20 = all->sd;
    if (psVar20->ldict != (namedlabels *)0x0) {
      namedlabels::~namedlabels(psVar20->ldict);
      free(all->sd->ldict);
      psVar20 = all->sd;
    }
    free(psVar20);
  }
  __ptr_00 = (all->final_prediction_sink)._begin;
  piVar17 = (all->final_prediction_sink)._end;
  local_b4[2] = (float)CONCAT71(in_register_00000031,delete_all);
  if (piVar17 != __ptr_00) {
    uVar21 = 0;
    do {
      if (__ptr_00[uVar21] != 1) {
        io_buf::close_file_or_socket(__ptr_00[uVar21]);
        __ptr_00 = (all->final_prediction_sink)._begin;
        piVar17 = (all->final_prediction_sink)._end;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < (ulong)((long)piVar17 - (long)__ptr_00 >> 2));
  }
  local_b4[1] = 0.0;
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  (all->final_prediction_sink)._begin = (int *)0x0;
  (all->final_prediction_sink)._end = (int *)0x0;
  (all->final_prediction_sink).end_array = (int *)0x0;
  pdVar15 = (all->loaded_dictionaries).
            super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((all->loaded_dictionaries).
      super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar15) {
    uVar21 = 0;
    do {
      if (pdVar15[uVar21].name != (char *)0x0) {
        free(pdVar15[uVar21].name);
        pdVar15 = (all->loaded_dictionaries).
                  super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pfVar19 = pdVar15[uVar21].dict;
      pcVar22 = *(char **)(pfVar19 + 0x18);
      pcVar14 = *(char **)(pfVar19 + 0x28);
      if (pcVar22 != pcVar14) {
        do {
          if (*pcVar22 == '\x01') {
            this = *(features **)(pcVar22 + 0x18);
            free(*(void **)(pcVar22 + 8));
            features::delete_v(this);
            operator_delete(this);
            pcVar14 = *(char **)(pfVar19 + 0x28);
          }
          pcVar22 = pcVar22 + 0x28;
        } while (pcVar22 != pcVar14);
        pfVar19 = (all->loaded_dictionaries).
                  super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar21].dict;
        pcVar22 = *(char **)(pfVar19 + 0x18);
      }
      if (pcVar22 != (char *)0x0) {
        free(pcVar22);
      }
      *(undefined8 *)(pfVar19 + 0x18) = 0;
      *(undefined8 *)(pfVar19 + 0x20) = 0;
      *(undefined8 *)(pfVar19 + 0x28) = 0;
      pdVar15 = (all->loaded_dictionaries).
                super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pdVar15[uVar21].dict != (feature_dict *)0x0) {
        free(pdVar15[uVar21].dict);
        pdVar15 = (all->loaded_dictionaries).
                  super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < (ulong)(((long)(all->loaded_dictionaries).
                                     super__Vector_base<dictionary_info,_std::allocator<dictionary_info>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar15 >> 3
                              ) * -0x5555555555555555));
  }
  if (all->loss != (loss_function *)0x0) {
    (*all->loss->_vptr_loss_function[9])();
  }
  fVar9 = local_b4[2];
  fVar8 = local_b4[1];
  if (all->all_reduce != (AllReduce *)0x0) {
    (*all->all_reduce->_vptr_AllReduce[1])();
  }
  if (SUB41(fVar9,0) != '\0') {
    vw::~vw(all);
    operator_delete(all);
  }
  if (SUB41(fVar8,0) != '\0') {
    this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
    vw_exception::vw_exception(this_00,&local_a8);
    __cxa_throw(this_00,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  vw_exception::~vw_exception(&local_a8);
  return;
}

Assistant:

void finish(vw& all, bool delete_all)
{
  // also update VowpalWabbit::PerformanceStatistics::get() (vowpalwabbit.cpp)
  if (!all.quiet && !all.options->was_supplied("audit_regressor"))
  {
    all.trace_message.precision(6);
    all.trace_message << std::fixed;
    all.trace_message << endl << "finished run";
    if (all.current_pass == 0 || all.current_pass == 1)
      all.trace_message << endl << "number of examples = " << all.sd->example_number;
    else
    {
      all.trace_message << endl << "number of examples per pass = " << all.sd->example_number / all.current_pass;
      all.trace_message << endl << "passes used = " << all.current_pass;
    }
    all.trace_message << endl << "weighted example sum = " << all.sd->weighted_examples();
    all.trace_message << endl << "weighted label sum = " << all.sd->weighted_labels;
    all.trace_message << endl << "average loss = ";
    if (all.holdout_set_off)
      if (all.sd->weighted_labeled_examples > 0)
        all.trace_message << all.sd->sum_loss / all.sd->weighted_labeled_examples;
      else
        all.trace_message << "n.a.";
    else if ((all.sd->holdout_best_loss == FLT_MAX) || (all.sd->holdout_best_loss == FLT_MAX * 0.5))
      all.trace_message << "undefined (no holdout)";
    else
      all.trace_message << all.sd->holdout_best_loss << " h";
    if (all.sd->report_multiclass_log_loss)
    {
      if (all.holdout_set_off)
        all.trace_message << endl
                          << "average multiclass log loss = "
                          << all.sd->multiclass_log_loss / all.sd->weighted_labeled_examples;
      else
        all.trace_message << endl
                          << "average multiclass log loss = "
                          << all.sd->holdout_multiclass_log_loss / all.sd->weighted_labeled_examples << " h";
    }

    float best_constant;
    float best_constant_loss;
    if (get_best_constant(all, best_constant, best_constant_loss))
    {
      all.trace_message << endl << "best constant = " << best_constant;
      if (best_constant_loss != FLT_MIN)
        all.trace_message << endl << "best constant's loss = " << best_constant_loss;
    }

    all.trace_message << endl << "total feature number = " << all.sd->total_features;
    if (all.sd->queries > 0)
      all.trace_message << endl << "total queries = " << all.sd->queries;
    all.trace_message << endl;
  }

  // implement finally.
  // finalize_regressor can throw if it can't write the file.
  // we still want to free up all the memory.
  vw_exception finalize_regressor_exception(__FILE__, __LINE__, "empty");
  bool finalize_regressor_exception_thrown = false;
  try
  {
    finalize_regressor(all, all.final_regressor_name);
  }
  catch (vw_exception& e)
  {
    finalize_regressor_exception = e;
    finalize_regressor_exception_thrown = true;
  }

  if (all.l != nullptr)
  {
    all.l->finish();
    free_it(all.l);
  }

  // Check if options object lifetime is managed internally.
  if (all.should_delete_options)
    delete all.options;

  // TODO: migrate all finalization into parser destructor
  free_parser(all);
  finalize_source(all.p);
  all.p->parse_name.clear();
  all.p->parse_name.delete_v();
  delete all.p;
  bool seeded;
  if (all.weights.seeded() > 0)
    seeded = true;
  else
    seeded = false;
  if (!seeded)
  {
    if (all.sd->ldict)
    {
      all.sd->ldict->~namedlabels();
      free(all.sd->ldict);
    }
    free(all.sd);
  }
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
    if (all.final_prediction_sink[i] != 1)
      io_buf::close_file_or_socket(all.final_prediction_sink[i]);
  all.final_prediction_sink.delete_v();
  for (size_t i = 0; i < all.loaded_dictionaries.size(); i++)
  {
    // Warning C6001 is triggered by the following:
    // (a) dictionary_info.name is allocated using 'calloc_or_throw<char>(strlen(s)+1)' and (b) freed using
    // 'free(all.loaded_dictionaries[i].name)'
    //
    // When the call to allocation is replaced by (a) 'new char[strlen(s)+1]' and deallocated using (b) 'delete []', the
    // warning goes away. Disable SDL warning.
    //    #pragma warning(disable:6001)
    free_it(all.loaded_dictionaries[i].name);
    //#pragma warning(default:6001)

    all.loaded_dictionaries[i].dict->iter(delete_dictionary_entry);
    all.loaded_dictionaries[i].dict->delete_v();
    free_it(all.loaded_dictionaries[i].dict);
  }
  delete all.loss;

  delete all.all_reduce;

  if (delete_all)
    delete &all;

  if (finalize_regressor_exception_thrown)
    throw finalize_regressor_exception;
}